

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall slang::parsing::Lexer::scanIdentifier(Lexer *this)

{
  char c_00;
  bool bVar1;
  Lexer *in_RDI;
  char c;
  
  while( true ) {
    c_00 = peek(in_RDI);
    bVar1 = isAlphaNumeric(c_00);
    if (((!bVar1) && (c_00 != '_')) && (c_00 != '$')) break;
    advance(in_RDI);
  }
  return;
}

Assistant:

void Lexer::scanIdentifier() {
    while (true) {
        char c = peek();
        if (isAlphaNumeric(c) || c == '_' || c == '$')
            advance();
        else
            return;
    }
}